

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linquadlagrfe.cc
# Opt level: O0

int main(int argc,char **argv)

{
  MeshFunctionReturnType<lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionGradFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:114:23)>_>_>_>
  MVar1;
  double dVar2;
  MeshFunctionReturnType<lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:109:18)>_>_>_>
  MVar3;
  double dVar4;
  int iVar5;
  uint uVar6;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *s;
  size_type sVar7;
  ostream *poVar8;
  variable_value *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  element_type *peVar9;
  undefined4 extraout_var;
  element_type *peVar10;
  undefined4 extraout_var_00;
  element_type *peVar11;
  Scalar *pSVar12;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  WithFormat<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_c18;
  string local_b20 [8];
  ofstream file;
  allocator<char> local_919;
  string local_918;
  allocator<char> local_8f1;
  string local_8f0;
  allocator<char> local_8c9;
  string local_8c8;
  allocator<char> local_8a1;
  string local_8a0;
  allocator<char> local_879;
  string local_878;
  allocator<char> local_851;
  string local_850;
  PredicateTrue local_829;
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:109:18)>_>
  local_828;
  MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:109:18)>_>_>
  local_7f0;
  double local_7b0;
  double L2_err_o2;
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:109:18)>_>
  local_7a0;
  MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:109:18)>_>_>
  local_768;
  double local_728;
  double L2_err_o1;
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionGradFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:114:23)>_>
  local_718;
  MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionGradFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:114:23)>_>_>
  local_6e0;
  double local_6a0;
  double H1_err_o2;
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionGradFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:114:23)>_>
  local_690;
  MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionGradFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:114:23)>_>_>
  local_658;
  double local_618;
  double H1_err_o1;
  undefined1 local_608 [7];
  anon_class_1_0_00000001 quadrule_provider;
  shared_ptr<const_lf::fe::ScalarFESpace<double>_> local_5f8;
  undefined1 local_5e8 [8];
  MeshFunctionGradFE<double,_double> mf_grad_o2;
  shared_ptr<const_lf::fe::ScalarFESpace<double>_> local_5b8;
  undefined1 local_5a8 [8];
  MeshFunctionFE<double,_double> mf_o2;
  undefined1 local_578 [8];
  VectorXd solution_o2;
  shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>_> fe_space_o2;
  shared_ptr<const_lf::fe::ScalarFESpace<double>_> local_548;
  undefined1 local_538 [8];
  MeshFunctionGradFE<double,_double> mf_grad_o1;
  shared_ptr<const_lf::fe::ScalarFESpace<double>_> local_508;
  undefined1 local_4f8 [8];
  MeshFunctionFE<double,_double> mf_o1;
  undefined1 local_4c8 [8];
  VectorXd solution_o1;
  shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>_> fe_space_o1;
  shared_ptr<const_lf::mesh::Mesh> mesh;
  unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> local_478;
  undefined1 local_470 [8];
  GmshReader reader;
  unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
  local_3e0;
  __single_object factory;
  undefined1 local_3b0 [8];
  path mesh_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  undefined1 local_348 [8];
  string mesh_name;
  int mesh_idx;
  MatrixXd results;
  path local_2e0;
  undefined1 local_2b8 [8];
  path mesh_folder;
  path here;
  undefined1 local_260 [8];
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:114:23)>
  mf_u_grad;
  undefined1 local_248 [6];
  anon_class_1_0_00000001_for_f_ u_grad;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:109:18)>
  mf_u;
  undefined1 local_230 [6];
  anon_class_1_0_00000001_for_f_ u;
  string local_210 [8];
  string output_file;
  key_type local_1e8;
  function_n<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_1c8;
  basic_parsed_options<char> local_1a8;
  undefined1 local_180 [8];
  variables_map vm;
  allocator<char> local_c1;
  string local_c0;
  undefined1 local_a0 [8];
  options_description desc;
  int num_meshes;
  char **argv_local;
  int argc_local;
  
  desc.groups.
  super__Vector_base<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"allowed options",&local_c1);
  boost::program_options::options_description::options_description
            ((options_description *)local_a0,&local_c0,0x50,0x28);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  vm.m_required._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)boost::program_options::options_description::add_options
                         ((options_description *)local_a0);
  s = boost::program_options::value<std::__cxx11::string>();
  boost::program_options::options_description_easy_init::operator()
            ((options_description_easy_init *)
             &vm.m_required._M_t._M_impl.super__Rb_tree_header._M_node_count,"output,o",
             (value_semantic *)s,"Name of the output file");
  boost::program_options::variables_map::variables_map((variables_map *)local_180);
  local_1c8.super_function_base.functor._8_8_ = 0;
  local_1c8.super_function_base.functor._16_8_ = 0;
  local_1c8.super_function_base.vtable = (vtable_base *)0x0;
  local_1c8.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  boost::
  function_n<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::function_n(&local_1c8);
  boost::program_options::parse_command_line<char>
            (&local_1a8,argc,argv,(options_description *)local_a0,0,&local_1c8);
  boost::program_options::store(&local_1a8,(variables_map *)local_180,false);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options(&local_1a8);
  boost::
  function_n<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function_n(&local_1c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e8,"output",
             (allocator<char> *)(output_file.field_2._M_local_buf + 0xf));
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)&vm.super_abstract_variables_map.m_next,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)(output_file.field_2._M_local_buf + 0xf));
  if (sVar7 == 0) {
    poVar8 = boost::program_options::operator<<
                       ((ostream *)&std::cout,(options_description *)local_a0);
    std::operator<<(poVar8,'\n');
    argv_local._4_4_ = 1;
    output_file.field_2._8_4_ = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_230,"output",(allocator<char> *)&mf_u.field_0xf);
    this = boost::program_options::variables_map::operator[]
                     ((variables_map *)local_180,(string *)local_230);
    __str = boost::program_options::variable_value::as<std::__cxx11::string>(this);
    std::__cxx11::string::string(local_210,__str);
    std::__cxx11::string::~string((string *)local_230);
    std::allocator<char>::~allocator((allocator<char> *)&mf_u.field_0xf);
    mf_u._14_1_ = 0;
    lf::mesh::utils::
    MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/lecturedemos/convergencestudies/linquadlagrfe.cc:109:18)>
    ::MeshFunctionGlobal
              ((MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:109:18)>
                *)local_248);
    mf_u_grad._14_1_ = 0;
    lf::mesh::utils::
    MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/lecturedemos/convergencestudies/linquadlagrfe.cc:114:23)>
    ::MeshFunctionGlobal
              ((MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:114:23)>
                *)local_260);
    std::filesystem::__cxx11::path::path<char[129],std::filesystem::__cxx11::path>
              ((path *)&mesh_folder._M_cmpts,
               (char (*) [129])
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/lecturedemos/convergencestudies/linquadlagrfe.cc"
               ,auto_format);
    std::filesystem::__cxx11::path::parent_path();
    std::filesystem::__cxx11::path::path<char[7],std::filesystem::__cxx11::path>
              ((path *)&results.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_cols,(char (*) [7])0xad4b2c,auto_format);
    std::filesystem::__cxx11::operator/
              ((path *)local_2b8,&local_2e0,
               (path *)&results.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_cols);
    std::filesystem::__cxx11::path::~path
              ((path *)&results.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_cols);
    std::filesystem::__cxx11::path::~path(&local_2e0);
    mesh_name.field_2._12_4_ = 7;
    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
              ((Matrix<double,_1,_1,0,_1,_1> *)&mesh_idx,
               (int *)((long)&desc.groups.
                              super__Vector_base<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
               (int *)(mesh_name.field_2._M_local_buf + 0xc));
    for (mesh_name.field_2._8_4_ = 0; (int)mesh_name.field_2._8_4_ < 7;
        mesh_name.field_2._8_4_ = mesh_name.field_2._8_4_ + 1) {
      poVar8 = std::operator<<((ostream *)&std::cout,"> Mesh Nr. ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,mesh_name.field_2._8_4_);
      std::operator<<(poVar8,'\n');
      poVar8 = std::operator<<((ostream *)&std::cout,"\t> Loading Mesh");
      std::operator<<(poVar8,'\n');
      std::__cxx11::to_string((string *)&mesh_file._M_cmpts,mesh_name.field_2._8_4_);
      std::operator+(&local_368,"unitsquare",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &mesh_file._M_cmpts);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                     &local_368,".msh");
      std::__cxx11::string::~string((string *)&local_368);
      std::__cxx11::string::~string((string *)&mesh_file._M_cmpts);
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                ((path *)&factory,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                 auto_format);
      std::filesystem::__cxx11::operator/((path *)local_3b0,(path *)local_2b8,(path *)&factory);
      std::filesystem::__cxx11::path::~path((path *)&factory);
      reader.nr_2_name_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 2;
      std::make_unique<lf::mesh::hybrid2d::MeshFactory,int>((int *)&local_3e0);
      std::unique_ptr<lf::mesh::MeshFactory,std::default_delete<lf::mesh::MeshFactory>>::
      unique_ptr<lf::mesh::hybrid2d::MeshFactory,std::default_delete<lf::mesh::hybrid2d::MeshFactory>,void>
                ((unique_ptr<lf::mesh::MeshFactory,std::default_delete<lf::mesh::MeshFactory>> *)
                 &local_478,&local_3e0);
      std::filesystem::__cxx11::path::string
                ((string *)
                 &mesh.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(path *)local_3b0);
      lf::io::GmshReader::GmshReader
                ((GmshReader *)local_470,&local_478,
                 (string *)
                 &mesh.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__cxx11::string::~string
                ((string *)
                 &mesh.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::
      ~unique_ptr(&local_478);
      lf::io::GmshReader::mesh
                ((GmshReader *)
                 &fe_space_o1.
                  super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::operator<<((ostream *)&std::cout,"\t> Linear Lagrangian FE");
      std::
      make_shared<lf::uscalfe::FeSpaceLagrangeO1<double>,std::shared_ptr<lf::mesh::Mesh_const>const&>
                ((shared_ptr<const_lf::mesh::Mesh> *)
                 &solution_o1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows);
      poVar8 = std::operator<<((ostream *)&std::cout," (");
      peVar9 = std::
               __shared_ptr_access<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&solution_o1.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_rows);
      iVar5 = (*(peVar9->super_UniformScalarFESpace<double>).super_ScalarFESpace<double>.
                _vptr_ScalarFESpace[1])();
      uVar6 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar5) + 0x10))();
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar6);
      poVar8 = std::operator<<(poVar8," DOFs)");
      std::operator<<(poVar8,'\n');
      std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>::
      shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,void>
                ((shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const> *)
                 &mf_o1.dof_vector_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows,
                 (shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>_> *)
                 &solution_o1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows);
      solvePoisson((shared_ptr<const_lf::mesh::Mesh> *)local_4c8,
                   (shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>_> *)
                   &fe_space_o1.
                    super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
      std::shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>_>::~shared_ptr
                ((shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>_> *)
                 &mf_o1.dof_vector_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows);
      std::shared_ptr<lf::fe::ScalarFESpace<double>const>::
      shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,void>
                ((shared_ptr<lf::fe::ScalarFESpace<double>const> *)&local_508,
                 (shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>_> *)
                 &solution_o1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
                ((Matrix<double,__1,_1,_0,__1,_1> *)
                 &mf_grad_o1.dof_vector_.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
                 (Matrix<double,__1,_1,_0,__1,_1> *)local_4c8);
      lf::fe::MeshFunctionFE<double,_double>::MeshFunctionFE
                ((MeshFunctionFE<double,_double> *)local_4f8,&local_508,
                 (Matrix<double,__1,_1,_0,__1,_1> *)
                 &mf_grad_o1.dof_vector_.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
                ((Matrix<double,__1,_1,_0,__1,_1> *)
                 &mf_grad_o1.dof_vector_.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
      std::shared_ptr<const_lf::fe::ScalarFESpace<double>_>::~shared_ptr(&local_508);
      std::shared_ptr<lf::fe::ScalarFESpace<double>const>::
      shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,void>
                ((shared_ptr<lf::fe::ScalarFESpace<double>const> *)&local_548,
                 (shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>_> *)
                 &solution_o1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
                ((Matrix<double,__1,_1,_0,__1,_1> *)
                 &fe_space_o2.
                  super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,(Matrix<double,__1,_1,_0,__1,_1> *)local_4c8);
      lf::fe::MeshFunctionGradFE<double,_double>::MeshFunctionGradFE
                ((MeshFunctionGradFE<double,_double> *)local_538,&local_548,
                 (Matrix<double,__1,_1,_0,__1,_1> *)
                 &fe_space_o2.
                  super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
                ((Matrix<double,__1,_1,_0,__1,_1> *)
                 &fe_space_o2.
                  super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::shared_ptr<const_lf::fe::ScalarFESpace<double>_>::~shared_ptr(&local_548);
      std::operator<<((ostream *)&std::cout,"\t> Quadratic Lagrangian FE");
      std::
      make_shared<lf::uscalfe::FeSpaceLagrangeO2<double>,std::shared_ptr<lf::mesh::Mesh_const>const&>
                ((shared_ptr<const_lf::mesh::Mesh> *)
                 &solution_o2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows);
      poVar8 = std::operator<<((ostream *)&std::cout," (");
      peVar10 = std::
                __shared_ptr_access<lf::uscalfe::FeSpaceLagrangeO2<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<lf::uscalfe::FeSpaceLagrangeO2<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&solution_o2.
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                 m_storage.m_rows);
      iVar5 = (*(peVar10->super_UniformScalarFESpace<double>).super_ScalarFESpace<double>.
                _vptr_ScalarFESpace[1])();
      uVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar5) + 0x10))();
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar6);
      poVar8 = std::operator<<(poVar8," DOFs)");
      std::operator<<(poVar8,'\n');
      std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>::
      shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>,void>
                ((shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const> *)
                 &mf_o2.dof_vector_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows,
                 (shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>_> *)
                 &solution_o2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows);
      solvePoisson((shared_ptr<const_lf::mesh::Mesh> *)local_578,
                   (shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>_> *)
                   &fe_space_o1.
                    super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
      std::shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>_>::~shared_ptr
                ((shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>_> *)
                 &mf_o2.dof_vector_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows);
      std::shared_ptr<lf::fe::ScalarFESpace<double>const>::
      shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>,void>
                ((shared_ptr<lf::fe::ScalarFESpace<double>const> *)&local_5b8,
                 (shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>_> *)
                 &solution_o2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
                ((Matrix<double,__1,_1,_0,__1,_1> *)
                 &mf_grad_o2.dof_vector_.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
                 (Matrix<double,__1,_1,_0,__1,_1> *)local_578);
      lf::fe::MeshFunctionFE<double,_double>::MeshFunctionFE
                ((MeshFunctionFE<double,_double> *)local_5a8,&local_5b8,
                 (Matrix<double,__1,_1,_0,__1,_1> *)
                 &mf_grad_o2.dof_vector_.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
                ((Matrix<double,__1,_1,_0,__1,_1> *)
                 &mf_grad_o2.dof_vector_.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
      std::shared_ptr<const_lf::fe::ScalarFESpace<double>_>::~shared_ptr(&local_5b8);
      std::shared_ptr<lf::fe::ScalarFESpace<double>const>::
      shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>,void>
                ((shared_ptr<lf::fe::ScalarFESpace<double>const> *)&local_5f8,
                 (shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>_> *)
                 &solution_o2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
                ((Matrix<double,__1,_1,_0,__1,_1> *)local_608,
                 (Matrix<double,__1,_1,_0,__1,_1> *)local_578);
      lf::fe::MeshFunctionGradFE<double,_double>::MeshFunctionGradFE
                ((MeshFunctionGradFE<double,_double> *)local_5e8,&local_5f8,
                 (Matrix<double,__1,_1,_0,__1,_1> *)local_608);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_608);
      std::shared_ptr<const_lf::fe::ScalarFESpace<double>_>::~shared_ptr(&local_5f8);
      poVar8 = std::operator<<((ostream *)&std::cout,"\t> Computing Error Norms");
      std::operator<<(poVar8,'\n');
      H1_err_o1._7_1_ = 0;
      peVar11 = std::
                __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator*((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&fe_space_o1.
                                super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
      lf::mesh::utils::
      operator-<lf::fe::MeshFunctionGradFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:114:23)>_>
                (&local_690,(MeshFunctionGradFE<double,_double> *)local_538,
                 (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:114:23)>
                  *)local_260);
      lf::mesh::utils::
      squaredNorm<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionGradFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:114:23)>_>_>
                (&local_658,&local_690);
      MVar1 = lf::fe::
              IntegrateMeshFunction<lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionGradFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:114:23)>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:165:36),_lf::base::PredicateTrue>
                        (peVar11,&local_658,(anon_class_1_0_00000001 *)((long)&H1_err_o1 + 7),
                         (PredicateTrue *)((long)&H1_err_o2 + 7),0);
      dVar2 = sqrt(MVar1);
      lf::mesh::utils::
      MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionGradFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/lecturedemos/convergencestudies/linquadlagrfe.cc:114:23)>_>_>
      ::~MeshFunctionUnary(&local_658);
      lf::mesh::utils::
      MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionGradFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/lecturedemos/convergencestudies/linquadlagrfe.cc:114:23)>_>
      ::~MeshFunctionBinary(&local_690);
      local_618 = dVar2;
      peVar11 = std::
                __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator*((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&fe_space_o1.
                                super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
      lf::mesh::utils::
      operator-<lf::fe::MeshFunctionGradFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:114:23)>_>
                (&local_718,(MeshFunctionGradFE<double,_double> *)local_5e8,
                 (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:114:23)>
                  *)local_260);
      lf::mesh::utils::
      squaredNorm<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionGradFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:114:23)>_>_>
                (&local_6e0,&local_718);
      MVar1 = lf::fe::
              IntegrateMeshFunction<lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionGradFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:114:23)>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:165:36),_lf::base::PredicateTrue>
                        (peVar11,&local_6e0,(anon_class_1_0_00000001 *)((long)&H1_err_o1 + 7),
                         (PredicateTrue *)((long)&L2_err_o1 + 7),0);
      dVar2 = sqrt(MVar1);
      lf::mesh::utils::
      MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionGradFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/lecturedemos/convergencestudies/linquadlagrfe.cc:114:23)>_>_>
      ::~MeshFunctionUnary(&local_6e0);
      lf::mesh::utils::
      MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionGradFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/lecturedemos/convergencestudies/linquadlagrfe.cc:114:23)>_>
      ::~MeshFunctionBinary(&local_718);
      local_6a0 = dVar2;
      peVar11 = std::
                __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator*((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&fe_space_o1.
                                super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
      lf::mesh::utils::
      operator-<lf::fe::MeshFunctionFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:109:18)>_>
                (&local_7a0,(MeshFunctionFE<double,_double> *)local_4f8,
                 (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:109:18)>
                  *)local_248);
      lf::mesh::utils::
      squaredNorm<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:109:18)>_>_>
                (&local_768,&local_7a0);
      MVar3 = lf::fe::
              IntegrateMeshFunction<lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:109:18)>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:165:36),_lf::base::PredicateTrue>
                        (peVar11,&local_768,(anon_class_1_0_00000001 *)((long)&H1_err_o1 + 7),
                         (PredicateTrue *)((long)&L2_err_o2 + 7),0);
      dVar2 = sqrt(MVar3);
      lf::mesh::utils::
      MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/lecturedemos/convergencestudies/linquadlagrfe.cc:109:18)>_>_>
      ::~MeshFunctionUnary(&local_768);
      lf::mesh::utils::
      MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/lecturedemos/convergencestudies/linquadlagrfe.cc:109:18)>_>
      ::~MeshFunctionBinary(&local_7a0);
      local_728 = dVar2;
      peVar11 = std::
                __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator*((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&fe_space_o1.
                                super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
      lf::mesh::utils::
      operator-<lf::fe::MeshFunctionFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:109:18)>_>
                (&local_828,(MeshFunctionFE<double,_double> *)local_5a8,
                 (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:109:18)>
                  *)local_248);
      lf::mesh::utils::
      squaredNorm<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:109:18)>_>_>
                (&local_7f0,&local_828);
      MVar3 = lf::fe::
              IntegrateMeshFunction<lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:109:18)>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_lecturedemos_convergencestudies_linquadlagrfe_cc:165:36),_lf::base::PredicateTrue>
                        (peVar11,&local_7f0,(anon_class_1_0_00000001 *)((long)&H1_err_o1 + 7),
                         &local_829,0);
      dVar2 = sqrt(MVar3);
      lf::mesh::utils::
      MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/lecturedemos/convergencestudies/linquadlagrfe.cc:109:18)>_>_>
      ::~MeshFunctionUnary(&local_7f0);
      lf::mesh::utils::
      MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/lecturedemos/convergencestudies/linquadlagrfe.cc:109:18)>_>
      ::~MeshFunctionBinary(&local_828);
      local_7b0 = dVar2;
      peVar11 = std::
                __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&fe_space_o1.
                                 super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount);
      uVar6 = (*peVar11->_vptr_Mesh[3])(peVar11,0);
      dVar2 = sqrt(1.0 / (double)uVar6);
      pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&mesh_idx
                           ,(long)(int)mesh_name.field_2._8_4_,0);
      *pSVar12 = dVar2;
      peVar9 = std::
               __shared_ptr_access<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&solution_o1.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_rows);
      iVar5 = (*(peVar9->super_UniformScalarFESpace<double>).super_ScalarFESpace<double>.
                _vptr_ScalarFESpace[1])();
      uVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar5) + 0x10))();
      pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&mesh_idx
                           ,(long)(int)mesh_name.field_2._8_4_,1);
      *pSVar12 = (double)uVar6;
      peVar10 = std::
                __shared_ptr_access<lf::uscalfe::FeSpaceLagrangeO2<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<lf::uscalfe::FeSpaceLagrangeO2<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&solution_o2.
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                 m_storage.m_rows);
      iVar5 = (*(peVar10->super_UniformScalarFESpace<double>).super_ScalarFESpace<double>.
                _vptr_ScalarFESpace[1])();
      uVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar5) + 0x10))();
      pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&mesh_idx
                           ,(long)(int)mesh_name.field_2._8_4_,2);
      dVar4 = local_618;
      *pSVar12 = (double)uVar6;
      pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&mesh_idx
                           ,(long)(int)mesh_name.field_2._8_4_,3);
      dVar2 = local_6a0;
      *pSVar12 = dVar4;
      pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&mesh_idx
                           ,(long)(int)mesh_name.field_2._8_4_,4);
      dVar4 = local_728;
      *pSVar12 = dVar2;
      pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&mesh_idx
                           ,(long)(int)mesh_name.field_2._8_4_,5);
      dVar2 = local_7b0;
      *pSVar12 = dVar4;
      pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&mesh_idx
                           ,(long)(int)mesh_name.field_2._8_4_,6);
      *pSVar12 = dVar2;
      lf::fe::MeshFunctionGradFE<double,_double>::~MeshFunctionGradFE
                ((MeshFunctionGradFE<double,_double> *)local_5e8);
      lf::fe::MeshFunctionFE<double,_double>::~MeshFunctionFE
                ((MeshFunctionFE<double,_double> *)local_5a8);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_578);
      std::shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>_>::~shared_ptr
                ((shared_ptr<lf::uscalfe::FeSpaceLagrangeO2<double>_> *)
                 &solution_o2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows);
      lf::fe::MeshFunctionGradFE<double,_double>::~MeshFunctionGradFE
                ((MeshFunctionGradFE<double,_double> *)local_538);
      lf::fe::MeshFunctionFE<double,_double>::~MeshFunctionFE
                ((MeshFunctionFE<double,_double> *)local_4f8);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_4c8);
      std::shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>_>::~shared_ptr
                ((shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>_> *)
                 &solution_o1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows);
      std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr
                ((shared_ptr<const_lf::mesh::Mesh> *)
                 &fe_space_o1.
                  super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      lf::io::GmshReader::~GmshReader((GmshReader *)local_470);
      std::
      unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
      ::~unique_ptr(&local_3e0);
      std::filesystem::__cxx11::path::~path((path *)local_3b0);
      std::__cxx11::string::~string((string *)local_348);
    }
    if (main::CSVFormat == '\0') {
      iVar5 = __cxa_guard_acquire(&main::CSVFormat);
      if (iVar5 != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_850,", ",&local_851);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_878,"\n",&local_879);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_8a0,"",&local_8a1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"",&local_8c9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_8f0,"",&local_8f1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_918,"",&local_919);
        Eigen::IOFormat::IOFormat
                  (&main::CSVFormat,-1,1,&local_850,&local_878,&local_8a0,&local_8c8,&local_8f0,
                   &local_918,' ');
        std::__cxx11::string::~string((string *)&local_918);
        std::allocator<char>::~allocator(&local_919);
        std::__cxx11::string::~string((string *)&local_8f0);
        std::allocator<char>::~allocator(&local_8f1);
        std::__cxx11::string::~string((string *)&local_8c8);
        std::allocator<char>::~allocator(&local_8c9);
        std::__cxx11::string::~string((string *)&local_8a0);
        std::allocator<char>::~allocator(&local_8a1);
        std::__cxx11::string::~string((string *)&local_878);
        std::allocator<char>::~allocator(&local_879);
        std::__cxx11::string::~string((string *)&local_850);
        std::allocator<char>::~allocator(&local_851);
        __cxa_atexit(Eigen::IOFormat::~IOFormat,&main::CSVFormat,&__dso_handle);
        __cxa_guard_release(&main::CSVFormat);
      }
    }
    std::ofstream::ofstream(local_b20);
    std::ofstream::open(local_b20,(_Ios_Openmode)local_210);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::format
              (&local_c18,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&mesh_idx,
               &main::CSVFormat);
    Eigen::operator<<((ostream *)local_b20,&local_c18);
    Eigen::WithFormat<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~WithFormat(&local_c18);
    std::ofstream::close();
    argv_local._4_4_ = 0;
    output_file.field_2._8_4_ = 1;
    std::ofstream::~ofstream(local_b20);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)&mesh_idx);
    std::filesystem::__cxx11::path::~path((path *)local_2b8);
    std::filesystem::__cxx11::path::~path((path *)&mesh_folder._M_cmpts);
    std::__cxx11::string::~string(local_210);
  }
  boost::program_options::variables_map::~variables_map((variables_map *)local_180);
  boost::program_options::options_description::~options_description((options_description *)local_a0)
  ;
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[]) {
  const int num_meshes = 7;

  po::options_description desc("allowed options");
  desc.add_options()("output,o", po::value<std::string>(),
                     "Name of the output file");
  po::variables_map vm;
  po::store(po::parse_command_line(argc, argv, desc), vm);
  if (vm.count("output") == 0) {
    std::cout << desc << '\n';
    return 1;
  }
  const std::string output_file = vm["output"].as<std::string>();

  // The analytic solution
  const auto u = [](const Eigen::VectorXd &x) -> double {
    return std::sin(lf::base::kPi * x[0]) * std::sin(lf::base::kPi * x[1]);
  };
  const lf::mesh::utils::MeshFunctionGlobal mf_u(u);
  // The gradient of the analytic solution
  const auto u_grad = [](const Eigen::Vector2d &x) -> Eigen::Vector2d {
    Eigen::Vector2d grad;
    grad[0] = lf::base::kPi * std::cos(lf::base::kPi * x[0]) *
              std::sin(lf::base::kPi * x[1]);
    grad[1] = lf::base::kPi * std::sin(lf::base::kPi * x[0]) *
              std::cos(lf::base::kPi * x[1]);
    return grad;
  };
  const lf::mesh::utils::MeshFunctionGlobal mf_u_grad(u_grad);

  const std::filesystem::path here = __FILE__;
  const std::filesystem::path mesh_folder = here.parent_path() / "meshes";
  Eigen::MatrixXd results(num_meshes, 7);
  for (int mesh_idx = 0; mesh_idx < num_meshes; ++mesh_idx) {
    std::cout << "> Mesh Nr. " << mesh_idx << '\n';

    // Load the mesh
    std::cout << "\t> Loading Mesh" << '\n';
    const std::string mesh_name =
        "unitsquare" + std::to_string(mesh_idx) + ".msh";
    const std::filesystem::path mesh_file = mesh_folder / mesh_name;
    auto factory = std::make_unique<lf::mesh::hybrid2d::MeshFactory>(2);
    const lf::io::GmshReader reader(std::move(factory), mesh_file.string());
    const auto mesh = reader.mesh();

    // Solve the problem with linear finite elements
    std::cout << "\t> Linear Lagrangian FE";
    const auto fe_space_o1 =
        std::make_shared<lf::uscalfe::FeSpaceLagrangeO1<double>>(mesh);
    std::cout << " (" << fe_space_o1->LocGlobMap().NumDofs() << " DOFs)"
              << '\n';
    const Eigen::VectorXd solution_o1 = solvePoisson(mesh, fe_space_o1);
    const lf::fe::MeshFunctionFE<double, double> mf_o1(fe_space_o1,
                                                       solution_o1);
    const lf::fe::MeshFunctionGradFE<double, double> mf_grad_o1(fe_space_o1,
                                                                solution_o1);

    // Solve the problem with quadratic finite elements
    std::cout << "\t> Quadratic Lagrangian FE";
    const auto fe_space_o2 =
        std::make_shared<lf::uscalfe::FeSpaceLagrangeO2<double>>(mesh);
    std::cout << " (" << fe_space_o2->LocGlobMap().NumDofs() << " DOFs)"
              << '\n';
    const Eigen::VectorXd solution_o2 = solvePoisson(mesh, fe_space_o2);
    const lf::fe::MeshFunctionFE<double, double> mf_o2(fe_space_o2,
                                                       solution_o2);
    const lf::fe::MeshFunctionGradFE<double, double> mf_grad_o2(fe_space_o2,
                                                                solution_o2);

    // Compute the H1 and L2 errors
    std::cout << "\t> Computing Error Norms" << '\n';
    const auto quadrule_provider = [](const lf::mesh::Entity &entity) {
      return lf::quad::make_QuadRule(entity.RefEl(), 6);
    };
    const double H1_err_o1 = std::sqrt(lf::fe::IntegrateMeshFunction(
        *mesh, lf::mesh::utils::squaredNorm(mf_grad_o1 - mf_u_grad),
        quadrule_provider));
    const double H1_err_o2 = std::sqrt(lf::fe::IntegrateMeshFunction(
        *mesh, lf::mesh::utils::squaredNorm(mf_grad_o2 - mf_u_grad),
        quadrule_provider));
    const double L2_err_o1 = std::sqrt(lf::fe::IntegrateMeshFunction(
        *mesh, lf::mesh::utils::squaredNorm(mf_o1 - mf_u), quadrule_provider));
    const double L2_err_o2 = std::sqrt(lf::fe::IntegrateMeshFunction(
        *mesh, lf::mesh::utils::squaredNorm(mf_o2 - mf_u), quadrule_provider));

    // Store the mesh width, the number of DOFs and the errors in the results
    // matrix
    results(mesh_idx, 0) = std::sqrt(1. / mesh->NumEntities(0));
    results(mesh_idx, 1) = fe_space_o1->LocGlobMap().NumDofs();
    results(mesh_idx, 2) = fe_space_o2->LocGlobMap().NumDofs();
    results(mesh_idx, 3) = H1_err_o1;
    results(mesh_idx, 4) = H1_err_o2;
    results(mesh_idx, 5) = L2_err_o1;
    results(mesh_idx, 6) = L2_err_o2;
  }

  // Output the resulting errors to a file
  const static Eigen::IOFormat CSVFormat(Eigen::StreamPrecision,
                                         Eigen::DontAlignCols, ", ", "\n");
  std::ofstream file;
  file.open(output_file);
  file << results.format(CSVFormat);
  file.close();

  return 0;
}